

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void __thiscall ParseInt32_Underscores_Test::TestBody(ParseInt32_Underscores_Test *this)

{
  ParseInt32_Underscores_Test *this_local;
  
  anon_unknown.dwarf_714a8::AssertInt32Equals(0x75bcd15,"12_345_6789",Both);
  anon_unknown.dwarf_714a8::AssertInt32Equals(0x75bcd15,"+12_345_6789",SignedAndUnsigned);
  anon_unknown.dwarf_714a8::AssertInt32Equals(0xf8a432eb,"-12345_6789",SignedAndUnsigned);
  anon_unknown.dwarf_714a8::AssertInt32Equals(0x13,"1______9",Both);
  anon_unknown.dwarf_714a8::AssertInt32Equals(0xabcd,"0xa_b_c_d",Both);
  anon_unknown.dwarf_714a8::AssertInt32Equals(0xabcd,"+0xa_b_c_d",SignedAndUnsigned);
  anon_unknown.dwarf_714a8::AssertInt32Equals(0xffff5433,"-0xa_b_c_d",SignedAndUnsigned);
  return;
}

Assistant:

TEST(ParseInt32, Underscores) {
  AssertInt32Equals(123456789, "12_345_6789", Both);
  AssertInt32Equals(123456789, "+12_345_6789", SignedAndUnsigned);
  AssertInt32Equals(-123456789, "-12345_6789", SignedAndUnsigned);
  AssertInt32Equals(19, "1______9", Both);
  AssertInt32Equals(0xabcd, "0xa_b_c_d", Both);
  AssertInt32Equals(0xabcd, "+0xa_b_c_d", SignedAndUnsigned);
  AssertInt32Equals(-0xabcd, "-0xa_b_c_d", SignedAndUnsigned);
}